

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
* deqp::gls::BuiltinPrecisionTests::createES3BuiltinCases(void)

{
  BuiltinFuncs *pBVar1;
  CaseFactory *pCVar2;
  MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  *in_RDI;
  MovePtr<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
  funcs;
  SharedPtr<deqp::gls::BuiltinPrecisionTests::SimpleFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
  local_620;
  value_type local_610;
  value_type local_600;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_5f0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_5e0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_5d0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_5c0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_5b0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_5a0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_590;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_580;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_570;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_560;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_550;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory> local_540;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  pBVar1 = (BuiltinFuncs *)operator_new(0x20);
  (pBVar1->super_CaseFactories)._vptr_CaseFactories = (_func_int **)&PTR__BuiltinFuncs_00c2e3c8;
  (pBVar1->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar1->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar1->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  funcs.
  super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
  .m_data.ptr = pBVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Add>(pBVar1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Sub>(pBVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Mul>(pBVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Div>(pBVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Radians>(pBVar1,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Degrees>(pBVar1,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Sin>(pBVar1,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Cos>(pBVar1,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Tan>(pBVar1,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ASin>(pBVar1,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ACos>(pBVar1,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"atan2",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ATan2>(pBVar1,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ATan>(pBVar1,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Sinh>(pBVar1,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Cosh>(pBVar1,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Tanh>(pBVar1,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ASinh>(pBVar1,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ACosh>(pBVar1,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::ATanh>(pBVar1,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Pow>(pBVar1,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Exp>(pBVar1,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Log>(pBVar1,&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Exp2>(pBVar1,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Log2>(pBVar1,&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Sqrt>(pBVar1,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::InverseSqrt>(pBVar1,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Abs>(pBVar1,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Sign>(pBVar1,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Floor>(pBVar1,&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Trunc>(pBVar1,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Round>(pBVar1,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::RoundEven>(pBVar1,&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Ceil>(pBVar1,&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Fract>(pBVar1,&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Mod>(pBVar1,&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  createSimpleFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Modf>();
  local_600.m_ptr = &(local_620.m_ptr)->super_CaseFactory;
  local_600.m_state = local_620.m_state;
  if (local_620.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_620.m_state)->strongRefCount = (local_620.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_620.m_state)->weakRefCount = (local_620.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(&pBVar1->m_factories,&local_600);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::release(&local_600);
  de::
  SharedPtr<deqp::gls::BuiltinPrecisionTests::SimpleFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
  ::release(&local_620);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Min>(pBVar1,&local_490);
  std::__cxx11::string::~string((string *)&local_490);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Max>(pBVar1,&local_4b0);
  std::__cxx11::string::~string((string *)&local_4b0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d0,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Clamp>(pBVar1,&local_4d0);
  std::__cxx11::string::~string((string *)&local_4d0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Mix>(pBVar1,&local_4f0);
  std::__cxx11::string::~string((string *)&local_4f0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_510,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Step>(pBVar1,&local_510);
  std::__cxx11::string::~string((string *)&local_510);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"",(allocator<char> *)&local_620);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::SmoothStep>(pBVar1,&local_530);
  std::__cxx11::string::~string((string *)&local_530);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_00c2e418;
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_540,pCVar2);
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(&pBVar1->m_factories,&local_540);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::release(&local_540);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_00c2fc68;
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_550,pCVar2);
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(&pBVar1->m_factories,&local_550);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::release(&local_550);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_00c30910;
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_560,pCVar2);
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(&pBVar1->m_factories,&local_560);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::release(&local_560);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  createSimpleFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Cross>();
  local_610.m_ptr = &(local_620.m_ptr)->super_CaseFactory;
  local_610.m_state = local_620.m_state;
  if (local_620.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_620.m_state)->strongRefCount = (local_620.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_620.m_state)->weakRefCount = (local_620.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(&pBVar1->m_factories,&local_610);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::release(&local_610);
  de::
  SharedPtr<deqp::gls::BuiltinPrecisionTests::SimpleFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
  ::release((SharedPtr<deqp::gls::BuiltinPrecisionTests::SimpleFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
             *)&local_620);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_00c309f0;
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_570,pCVar2);
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(&pBVar1->m_factories,&local_570);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::release(&local_570);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_00c31768;
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_580,pCVar2);
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(&pBVar1->m_factories,&local_580);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::release(&local_580);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_00c32aa0;
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_590,pCVar2);
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(&pBVar1->m_factories,&local_590);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::release(&local_590);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_00c33628;
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_5a0,pCVar2);
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(&pBVar1->m_factories,&local_5a0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::release(&local_5a0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_00c33ea0;
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_5b0,pCVar2);
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(&pBVar1->m_factories,&local_5b0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::release(&local_5b0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_00c36318;
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_5c0,pCVar2);
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(&pBVar1->m_factories,&local_5c0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::release(&local_5c0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_00c37600;
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_5d0,pCVar2);
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(&pBVar1->m_factories,&local_5d0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::release(&local_5d0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_00c388e8;
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_5e0,pCVar2);
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(&pBVar1->m_factories,&local_5e0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::release(&local_5e0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  pCVar2 = (CaseFactory *)operator_new(8);
  pCVar2->_vptr_CaseFactory = (_func_int **)&PTR__CaseFactory_00c38ce0;
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::SharedPtr(&local_5f0,pCVar2);
  std::
  vector<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ::push_back(&pBVar1->m_factories,&local_5f0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>::release(&local_5f0);
  pBVar1 = funcs.
           super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
           .m_data.ptr;
  funcs.
  super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
  .m_data.ptr = (BuiltinFuncs *)0x0;
  (in_RDI->
  super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  ).m_data.ptr = &pBVar1->super_CaseFactories;
  de::details::
  UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
  ::~UniqueBase(&funcs.
                 super_UniqueBase<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs,_de::DefaultDeleter<deqp::gls::BuiltinPrecisionTests::BuiltinFuncs>_>
               );
  return in_RDI;
}

Assistant:

MovePtr<const CaseFactories> createES3BuiltinCases (void)
{
	MovePtr<BuiltinFuncs>	funcs	(new BuiltinFuncs());

	addScalarFactory<Add>(*funcs);
	addScalarFactory<Sub>(*funcs);
	addScalarFactory<Mul>(*funcs);
	addScalarFactory<Div>(*funcs);

	addScalarFactory<Radians>(*funcs);
	addScalarFactory<Degrees>(*funcs);
	addScalarFactory<Sin>(*funcs);
	addScalarFactory<Cos>(*funcs);
	addScalarFactory<Tan>(*funcs);
	addScalarFactory<ASin>(*funcs);
	addScalarFactory<ACos>(*funcs);
	addScalarFactory<ATan2>(*funcs, "atan2");
	addScalarFactory<ATan>(*funcs);
	addScalarFactory<Sinh>(*funcs);
	addScalarFactory<Cosh>(*funcs);
	addScalarFactory<Tanh>(*funcs);
	addScalarFactory<ASinh>(*funcs);
	addScalarFactory<ACosh>(*funcs);
	addScalarFactory<ATanh>(*funcs);

	addScalarFactory<Pow>(*funcs);
	addScalarFactory<Exp>(*funcs);
	addScalarFactory<Log>(*funcs);
	addScalarFactory<Exp2>(*funcs);
	addScalarFactory<Log2>(*funcs);
	addScalarFactory<Sqrt>(*funcs);
	addScalarFactory<InverseSqrt>(*funcs);

	addScalarFactory<Abs>(*funcs);
	addScalarFactory<Sign>(*funcs);
	addScalarFactory<Floor>(*funcs);
	addScalarFactory<Trunc>(*funcs);
	addScalarFactory<Round>(*funcs);
	addScalarFactory<RoundEven>(*funcs);
	addScalarFactory<Ceil>(*funcs);
	addScalarFactory<Fract>(*funcs);
	addScalarFactory<Mod>(*funcs);
	funcs->addFactory(createSimpleFuncCaseFactory<Modf>());
	addScalarFactory<Min>(*funcs);
	addScalarFactory<Max>(*funcs);
	addScalarFactory<Clamp>(*funcs);
	addScalarFactory<Mix>(*funcs);
	addScalarFactory<Step>(*funcs);
	addScalarFactory<SmoothStep>(*funcs);

	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<Length>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<Distance>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<Dot>()));
	funcs->addFactory(createSimpleFuncCaseFactory<Cross>());
	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<Normalize>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<FaceForward>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<Reflect>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new TemplateFuncCaseFactory<Refract>()));


	funcs->addFactory(SharedPtr<const CaseFactory>(new MatrixFuncCaseFactory<MatrixCompMult>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new MatrixFuncCaseFactory<OuterProduct>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new MatrixFuncCaseFactory<Transpose>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new SquareMatrixFuncCaseFactory<Determinant>()));
	funcs->addFactory(SharedPtr<const CaseFactory>(new SquareMatrixFuncCaseFactory<Inverse>()));

	return MovePtr<const CaseFactories>(funcs.release());
}